

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ModuleData * __thiscall ExpressionContext::GetSourceOwner(ExpressionContext *this,Lexeme *lexeme)

{
  ModuleData *pMVar1;
  ModuleData *pMVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  pMVar1 = (ModuleData *)lexeme->pos;
  if ((pMVar1 < (ModuleData *)this->code) || ((ModuleData *)this->codeEnd < pMVar1)) {
    uVar3 = (ulong)(this->uniqueDependencies).count;
    bVar5 = uVar3 != 0;
    if (bVar5) {
      pMVar2 = pMVar1;
      uVar4 = 1;
      do {
        pMVar1 = (this->uniqueDependencies).data[uVar4 - 1];
        if ((lexeme < pMVar1->lexStream) || (pMVar1->lexStream + pMVar1->lexStreamSize < lexeme)) {
          bVar6 = true;
          pMVar1 = pMVar2;
        }
        else {
          bVar6 = false;
        }
        if (!bVar6) break;
        bVar5 = uVar4 < uVar3;
        bVar6 = uVar4 != uVar3;
        pMVar2 = pMVar1;
        uVar4 = uVar4 + 1;
      } while (bVar6);
    }
    if (!bVar5) {
      __assert_fail("!\"failed to find source owner\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x808,"ModuleData *ExpressionContext::GetSourceOwner(Lexeme *)");
    }
  }
  else {
    pMVar1 = (ModuleData *)0x0;
  }
  return pMVar1;
}

Assistant:

ModuleData* ExpressionContext::GetSourceOwner(Lexeme *lexeme)
{
	// Fast check for current module
	if(lexeme->pos >= code && lexeme->pos <= codeEnd)
		return NULL;

	for(unsigned i = 0; i < uniqueDependencies.size(); i++)
	{
		ModuleData *moduleData = uniqueDependencies[i];

		if(lexeme >= moduleData->lexStream && lexeme <= moduleData->lexStream + moduleData->lexStreamSize)
			return moduleData;
	}

	// Should not get here
	assert(!"failed to find source owner");
	return NULL;
}